

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseUDP.cpp
# Opt level: O0

void __thiscall tonk::UDPSocket::AddFirewallRule(UDPSocket *this)

{
  io_context *in_RDI;
  io_context *ctx;
  
  ctx = in_RDI;
  std::__atomic_base<int>::operator++((__atomic_base<int> *)&(in_RDI[8].impl_)->one_thread_);
  std::__shared_ptr_access<asio::io_context,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
            ((__shared_ptr_access<asio::io_context,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_RDI);
  asio::post<asio::io_context,tonk::UDPSocket::AddFirewallRule()::__0>(ctx,(type *)in_RDI,in_RDI);
  return;
}

Assistant:

void UDPSocket::AddFirewallRule()
{
    // Add firewall rule from a background thread
    Deps.SocketRefCount->IncrementReferences();
    asio::post(*Deps.Context, [this]()
    {
        Firewall_AddPort(LocalBoundPort);
        Deps.SocketRefCount->DecrementReferences();
    });
}